

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::DataBarReader::decodePattern
          (Barcode *__return_storage_ptr__,DataBarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var7;
  bool bVar8;
  DecodingState *pDVar9;
  Iterator puVar10;
  ZXing *pZVar11;
  uint uVar12;
  ZXing *this_00;
  int iVar13;
  int iVar14;
  __hashtable *__h;
  __hashtable *__h_1;
  DecodingState *pDVar15;
  Pair *last;
  _func_int **pp_Var16;
  Pair *first;
  Pair leftPair;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  ulong local_1e0;
  long local_1d8 [2];
  Content local_1c8;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  PointT<int> local_168;
  PointT<int> PStack_160;
  PointT<int> local_158;
  PointT<int> PStack_150;
  _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_148;
  ByteArray local_140;
  DecoderResult local_128;
  Position local_50;
  
  if ((state->_M_t).
      super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      ._M_t.
      super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl ==
      (DecodingState *)0x0) {
    pDVar9 = (DecodingState *)operator_new(0x78);
    pDVar9->_vptr_DecodingState = (_func_int **)&PTR__State_001f9508;
    pDVar9[1]._vptr_DecodingState = (_func_int **)(pDVar9 + 7);
    pDVar9[2]._vptr_DecodingState = (_func_int **)0x1;
    pDVar9[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar9[4]._vptr_DecodingState = (_func_int **)0x0;
    *(undefined4 *)&pDVar9[5]._vptr_DecodingState = 0x3f800000;
    pDVar9[6]._vptr_DecodingState = (_func_int **)0x0;
    pDVar9[7]._vptr_DecodingState = (_func_int **)0x0;
    pDVar9[8]._vptr_DecodingState = (_func_int **)(pDVar9 + 0xe);
    pDVar9[9]._vptr_DecodingState = (_func_int **)0x1;
    pDVar9[10]._vptr_DecodingState = (_func_int **)0x0;
    pDVar9[0xb]._vptr_DecodingState = (_func_int **)0x0;
    *(undefined4 *)&pDVar9[0xc]._vptr_DecodingState = 0x3f800000;
    pDVar9[0xd]._vptr_DecodingState = (_func_int **)0x0;
    pDVar9[0xe]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar9;
  }
  pDVar9 = (state->_M_t).
           super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
           ._M_t.
           super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
           .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  next->_size = 0x16;
  puVar10 = next->_data;
  if (puVar10 != (Iterator)0x0) {
    do {
      next->_data = puVar10 + 1;
      if (next->_end < puVar10 + (long)next->_size + 1) break;
      puVar10 = next->_data;
      uVar4 = puVar10[0xb];
      uVar12 = (uint)puVar10[0xc] + (uint)uVar4;
      if ((((uVar12 * 9 < ((uint)puVar10[10] + (uint)puVar10[9]) * 2 + 5) &&
           (iVar13 = ((uint)puVar10[10] + (uint)puVar10[9]) * 2 + -5,
           SBORROW4(iVar13,uVar12 * 0xd) != (int)(iVar13 + uVar12 * -0xd) < 0)) &&
          ((uint)puVar10[8] < (uint)puVar10[0xc] * 4 + 2)) &&
         (((uVar12 < (uint)puVar10[8] << 2 &&
           ((int)(((uint)uVar4 + (uint)uVar4 * 2 >> 2) - 2) < (int)(uint)puVar10[-1])) &&
          (((uint)puVar10[-1] < (uint)uVar4 + (uint)(uVar4 >> 2) + 2 &&
           (bVar8 = IsCharacterPair(*next,0x10,0xf), bVar8)))))) {
        ReadPair((Pair *)&local_128,next,false);
        if ((int)local_128._content.bytes.
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) {
          local_128._content.encodings.
          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(rowNumber,
                                 local_128._content.encodings.
                                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_4_);
          local_188._0_8_ =
               (_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(pDVar9 + 1);
          std::
          _Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<ZXing::OneD::DataBar::Pair_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<ZXing::OneD::DataBar::Pair,false>>>>
                    ((_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(pDVar9 + 1),&local_128,local_188);
          if (next->_data != (Iterator)0x0) {
            next->_data = next->_data + 0x14;
          }
        }
      }
      puVar10 = next->_data;
      if ((puVar10 != (Iterator)0x0) &&
         (next->_data = puVar10 + 1, puVar10 + (long)next->_size + 1 <= next->_end)) {
        puVar10 = next->_data;
        uVar4 = puVar10[9];
        uVar12 = (uint)puVar10[8] + (uint)uVar4;
        if (((uVar12 * 9 < ((uint)puVar10[10] + (uint)puVar10[0xb]) * 2 + 5) &&
            ((((iVar13 = ((uint)puVar10[10] + (uint)puVar10[0xb]) * 2 + -5,
               SBORROW4(iVar13,uVar12 * 0xd) != (int)(iVar13 + uVar12 * -0xd) < 0 &&
               ((uint)puVar10[0xc] < (uint)puVar10[8] * 4 + 2)) &&
              (uVar12 < (uint)puVar10[0xc] << 2)) &&
             ((uVar5 = puVar10[0x15],
              (int)(((uint)uVar5 + (uint)uVar5 * 2 >> 2) - 2) < (int)(uint)uVar4 &&
              ((uint)uVar4 < (uint)uVar5 + (uint)(uVar5 >> 2) + 2)))))) &&
           (bVar8 = IsCharacterPair(*next,0xf,0x10), bVar8)) {
          ReadPair((Pair *)&local_128,next,true);
          if ((int)local_128._content.bytes.
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != 0) {
            local_128._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(rowNumber,
                                   local_128._content.encodings.
                                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
            local_188._0_8_ =
                 (_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)(pDVar9 + 8);
            std::
            _Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<ZXing::OneD::DataBar::Pair_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<ZXing::OneD::DataBar::Pair,false>>>>
                      ((_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)(pDVar9 + 8),&local_128,local_188);
            if (next->_data != (Iterator)0x0) {
              next->_data = next->_data + 0x17;
            }
          }
        }
      }
      puVar10 = next->_data;
    } while (puVar10 != (Iterator)0x0);
  }
  pp_Var16 = pDVar9[3]._vptr_DecodingState;
  if (pp_Var16 == (_func_int **)0x0) {
LAB_0015ec96:
    next->_base = (Iterator)0x0;
    next->_end = (Iterator)0x0;
    next->_data = (Iterator)0x0;
    *(undefined8 *)&next->_size = 0;
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
  }
  else {
    pDVar15 = pDVar9 + 10;
    do {
      while (pDVar15 = (DecodingState *)pDVar15->_vptr_DecodingState,
            pDVar15 == (DecodingState *)0x0) {
        pp_Var16 = (_func_int **)*pp_Var16;
        pDVar15 = pDVar9 + 10;
        if (pp_Var16 == (_func_int **)0x0) goto LAB_0015ec96;
      }
      iVar13 = *(int *)(pp_Var16 + 3);
      iVar14 = *(int *)&pDVar15[3]._vptr_DecodingState;
      iVar6 = -iVar13;
      if (0 < iVar13) {
        iVar6 = iVar13;
      }
      iVar13 = -iVar14;
      if (0 < iVar14) {
        iVar13 = iVar14;
      }
      iVar14 = iVar13 + iVar6 * 9 + -10;
      iVar13 = iVar13 + -0xb + iVar6 * 9;
      if (iVar14 < 0x49) {
        iVar13 = iVar14;
      }
    } while ((*(int *)((long)pp_Var16 + 0x14) * 4 + *(int *)((long)pp_Var16 + 0xc) +
              *(int *)((long)(pDVar15 + 1) + 4) * 0x10 + *(int *)((long)(pDVar15 + 2) + 4) * 0x40) %
             0x4f != iVar13 - (uint)(8 < iVar13));
    pZVar11 = (ZXing *)((long)*(int *)&pDVar15[1]._vptr_DecodingState * 0x63d +
                       ((long)*(int *)(pp_Var16 + 1) * 0x63d + (long)*(int *)(pp_Var16 + 2)) *
                       0x453af5 + (long)*(int *)&pDVar15[2]._vptr_DecodingState);
    this_00 = pZVar11 + -10000000000000;
    if ((long)pZVar11 < 10000000000000) {
      this_00 = pZVar11;
    }
    ToString<long_long,void>((string *)local_188,this_00,0xd,(int)pZVar11);
    GTIN::ComputeCheckDigit<char>((string *)local_188,false);
    local_1e8._M_current = (char *)local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_188._0_8_,(pointer)(local_188._8_8_ + local_188._0_8_));
    std::__cxx11::string::_M_replace_aux((ulong)&local_1e8,local_1e0,0,'\x01');
    if ((_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)local_188._0_8_ !=
        (_Hashtable<ZXing::OneD::DataBar::Pair,ZXing::OneD::DataBar::Pair,std::allocator<ZXing::OneD::DataBar::Pair>,std::__detail::_Identity,std::equal_to<ZXing::OneD::DataBar::Pair>,ZXing::OneD::DataBar::PairHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,local_178._M_allocated_capacity + 1);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_140,local_1e8,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_1e8._M_current + local_1e0),(allocator_type *)local_188);
    local_148 = (_Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(pDVar9 + 1);
    Content::Content(&local_1c8,&local_140,(SymbologyIdentifier)0x3065);
    first = (Pair *)(pp_Var16 + 1);
    last = (Pair *)(pDVar15 + 1);
    paVar1 = &local_128._ecLevel.field_2;
    local_128._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_128._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_128._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_1c8.encodings.
         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_128._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1c8.encodings.
         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_128._content.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1c8.encodings.
         super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1c8.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.encodings.
    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._content.symbology = local_1c8.symbology;
    local_128._content.defaultCharset = local_1c8.defaultCharset;
    local_128._content.hasECI = local_1c8.hasECI;
    local_128._ecLevel._M_string_length = 0;
    local_128._ecLevel.field_2._M_local_buf[0] = '\0';
    local_128._lineCount = 0;
    local_128._versionNumber = 0;
    local_128._structuredAppend.index = -1;
    local_128._structuredAppend.count = -1;
    paVar2 = &local_128._structuredAppend.id.field_2;
    local_128._structuredAppend.id._M_string_length = 0;
    local_128._structuredAppend.id.field_2._M_local_buf[0] = '\0';
    local_128._isMirrored = false;
    local_128._readerInit = false;
    paVar3 = &local_128._error._msg.field_2;
    local_128._error._msg._M_string_length = 0;
    local_128._error._msg.field_2._M_local_buf[0] = '\0';
    local_128._error._file = (char *)0x0;
    local_128._error._line = -1;
    local_128._error._type = None;
    local_128._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_128._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128._ecLevel._M_dataplus._M_p = (pointer)paVar1;
    local_128._structuredAppend.id._M_dataplus._M_p = (pointer)paVar2;
    local_128._error._msg._M_dataplus._M_p = (pointer)paVar3;
    iVar13 = DataBar::EstimateLineCount(first,last);
    local_128._lineCount = iVar13;
    DataBar::EstimatePosition(&local_50,first,last);
    local_178._M_allocated_capacity = 0;
    local_178._8_8_ = 0;
    local_188._0_8_ = (pointer)0x0;
    local_188._8_8_ = (pointer)0x0;
    local_168 = local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[0];
    PStack_160 = local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[1];
    local_158 = local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[2];
    PStack_150 = local_50.super_array<ZXing::PointT<int>,_4UL>._M_elems[3];
    Result::Result(__return_storage_ptr__,&local_128,(DetectorResult *)local_188,DataBar);
    if ((pointer)local_188._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_188._8_8_,local_178._8_8_ - local_188._8_8_);
    }
    if (local_128._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._error._msg._M_dataplus._M_p != paVar3) {
      operator_delete(local_128._error._msg._M_dataplus._M_p,
                      CONCAT71(local_128._error._msg.field_2._M_allocated_capacity._1_7_,
                               local_128._error._msg.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._structuredAppend.id._M_dataplus._M_p != paVar2) {
      operator_delete(local_128._structuredAppend.id._M_dataplus._M_p,
                      CONCAT71(local_128._structuredAppend.id.field_2._M_allocated_capacity._1_7_,
                               local_128._structuredAppend.id.field_2._M_local_buf[0]) + 1);
    }
    p_Var7 = local_148;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._ecLevel._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._ecLevel._M_dataplus._M_p,
                      CONCAT71(local_128._ecLevel.field_2._M_allocated_capacity._1_7_,
                               local_128._ecLevel.field_2._M_local_buf[0]) + 1);
    }
    if (local_128._content.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128._content.encodings.
                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_128._content.encodings.
                            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128._content.encodings.
                            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_128._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128._content.bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128._content.bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c8.encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.encodings.
                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.encodings.
                            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.encodings.
                            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_140.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_140.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_140.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_140.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((long *)local_1e8._M_current != local_1d8) {
      operator_delete(local_1e8._M_current,local_1d8[0] + 1);
    }
    std::
    _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(p_Var7,first);
    std::
    _Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase((_Hashtable<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::Pair,_std::allocator<ZXing::OneD::DataBar::Pair>,_std::__detail::_Identity,_std::equal_to<ZXing::OneD::DataBar::Pair>,_ZXing::OneD::DataBar::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)(pDVar9 + 8),last);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode DataBarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	next = next.subView(-1, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair());
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(2)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false); leftPair && next.shift(FULL_PAIR_SIZE) && IsRightPair(next)) {
				if (auto rightPair = ReadPair(next, true); rightPair && ChecksumIsValid(leftPair, rightPair)) {
					return {ConstructText(leftPair, rightPair), rowNumber, leftPair.xStart, rightPair.xStop,
							BarcodeFormat::DataBar};
				}
			}
		}
	}
#else
	if (!state)
		state.reset(new State);
	auto* prevState = static_cast<State*>(state.get());

	next = next.subView(0, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair()
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(1)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false)) {
				leftPair.y = rowNumber;
				prevState->leftPairs.insert(leftPair);
				next.shift(FULL_PAIR_SIZE - 1);
			}
		}

		if (next.shift(1) && IsRightPair(next)) {
			if (auto rightPair = ReadPair(next, true)) {
				rightPair.y = rowNumber;
				prevState->rightPairs.insert(rightPair);
				next.shift(FULL_PAIR_SIZE + 2);
			}
		}
	}

	for (const auto& leftPair : prevState->leftPairs)
		for (const auto& rightPair : prevState->rightPairs)
			if (ChecksumIsValid(leftPair, rightPair)) {
				// Symbology identifier ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
				Barcode res{DecoderResult(Content(ByteArray(ConstructText(leftPair, rightPair)), {'e', '0'}))
								.setLineCount(EstimateLineCount(leftPair, rightPair)),
							{{}, EstimatePosition(leftPair, rightPair)},
							BarcodeFormat::DataBar};

				prevState->leftPairs.erase(leftPair);
				prevState->rightPairs.erase(rightPair);
				return res;
			}
#endif

	// guarantee progress (see loop in ODReader.cpp)
	next = {};

	return {};
}